

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiView.cpp
# Opt level: O0

string * Imf_3_4::insertViewName(string *channel,StringVector *multiView,int i)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  int in_ECX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  string *in_RSI;
  string *in_RDI;
  size_t j;
  StringVector s;
  string *newName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  string *this;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  allocator<char> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  string local_b8 [32];
  string local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  undefined1 local_6d;
  undefined4 local_6c;
  allocator<char> local_65 [12];
  char in_stack_ffffffffffffffa7;
  string *in_stack_ffffffffffffffa8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  int local_1c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  string *local_10;
  
  this_00 = (string *)&stack0xffffffffffffffa8;
  this = in_RDI;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string(this_00,in_RSI);
  anon_unknown_5::parseString(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa7);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_38);
  if (sVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    std::allocator<char>::~allocator(local_65);
  }
  else {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_38);
    if ((sVar2 == 1) && (local_1c == 0)) {
      std::__cxx11::string::string((string *)this,local_10);
    }
    else {
      local_6d = 0;
      std::__cxx11::string::string((string *)this);
      local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      while (__rhs = local_78,
            pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size(&local_38), pbVar1 = local_78, __rhs < pbVar3) {
        sVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&local_38);
        if (pbVar1 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (sVar2 - 1)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_38,(size_type)local_78);
          std::operator+(in_stack_ffffffffffffff28,(char *)this_00);
          std::__cxx11::string::operator+=((string *)this,local_98);
          std::__cxx11::string::~string(local_98);
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](local_18,(long)local_1c);
          std::operator+(in_stack_ffffffffffffff28,(char *)this_00);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_38,(size_type)local_78);
          std::operator+(in_stack_ffffffffffffff08,__rhs);
          std::__cxx11::string::operator+=((string *)this,local_b8);
          std::__cxx11::string::~string(local_b8);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
        }
        local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_78->field_0x1;
      }
      local_6d = 1;
    }
  }
  local_6c = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this);
  return in_RDI;
}

Assistant:

string
insertViewName (const string& channel, const StringVector& multiView, int i)
{
    //
    // Insert multiView[i] into the channel name if appropriate.
    //

    StringVector s = parseString (channel, '.');

    if (s.size () == 0) return ""; // nothing in, nothing out

    if (s.size () == 1 && i == 0)
    {
        //
        // Channel in the default view, with no periods in its name.
        // Do not insert view name.
        //

        return channel;
    }

    //
    // View name becomes penultimate section of new channel name.
    //

    string newName;

    for (size_t j = 0; j < s.size (); ++j)
    {
        if (j < s.size () - 1)
            newName += s[j] + ".";
        else
            newName += multiView[i] + "." + s[j];
    }

    return newName;
}